

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O0

void __thiscall
tonk::SDKConnectionList<MyServerConnection>::Remove
          (SDKConnectionList<MyServerConnection> *this,SDKConnection *connection)

{
  bool bVar1;
  iterator __first;
  anon_class_8_1_6f3cc89c_for__M_pred in_RDI;
  lock_guard<std::mutex> locker;
  mutex_type *in_stack_ffffffffffffff68;
  __normal_iterator<const_std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
  *in_stack_ffffffffffffff70;
  vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff90;
  __normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
  in_stack_ffffffffffffff98;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = std::
          vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
          ::empty(in_stack_ffffffffffffff80);
  if (!bVar1) {
    std::
    vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
    ::begin((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
             *)in_stack_ffffffffffffff68);
    std::
    vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
    ::end((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
           *)in_stack_ffffffffffffff68);
    std::
    remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<tonk::SDKConnection>*,std::vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>>,tonk::SDKConnectionList<MyServerConnection>::Remove(tonk::SDKConnection*)::_lambda(std::shared_ptr<tonk::SDKConnection>const&)_1_>
              (in_stack_ffffffffffffff98,
               (__normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
                )in_stack_ffffffffffffff90._M_current,in_RDI);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<tonk::SDKConnection>const*,std::vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>>
    ::__normal_iterator<std::shared_ptr<tonk::SDKConnection>*>
              (in_stack_ffffffffffffff70,
               (__normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
                *)in_stack_ffffffffffffff68);
    __first = std::
              vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
              ::end((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                     *)in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<tonk::SDKConnection>const*,std::vector<std::shared_ptr<tonk::SDKConnection>,std::allocator<std::shared_ptr<tonk::SDKConnection>>>>
    ::__normal_iterator<std::shared_ptr<tonk::SDKConnection>*>
              (in_stack_ffffffffffffff70,
               (__normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
                *)in_stack_ffffffffffffff68);
    std::
    vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
    ::erase((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
             *)in_RDI.connection,(const_iterator)__first._M_current,in_stack_ffffffffffffff90);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x107aa6);
  return;
}

Assistant:

void Remove(SDKConnection* connection)
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);
        if (ConnectionList.empty()) {
            return;
        }
        ConnectionList.erase(
            std::remove_if(ConnectionList.begin(), ConnectionList.end(),
                [connection](std::shared_ptr<SDKConnection> const& i)
        {
            return i.get() == connection;
        }), ConnectionList.end());
    }